

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_UnaryFuncPrecedence_Test::~ExprWriterTest_UnaryFuncPrecedence_Test
          (ExprWriterTest_UnaryFuncPrecedence_Test *this)

{
  void *in_RDI;
  
  ~ExprWriterTest_UnaryFuncPrecedence_Test((ExprWriterTest_UnaryFuncPrecedence_Test *)0x134bc8);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, UnaryFuncPrecedence) {
  auto x1 = MakeVariable(0);
  for (int i = ex::FIRST_UNARY; i < ex::LAST_UNARY; ++i) {
    ex::Kind kind = static_cast<ex::Kind>(i);
    if (kind == ex::MINUS || kind == ex::POW2)
      continue;
    CHECK_WRITE(fmt::format("{0}({0}(x1))", str(kind)),
        MakeUnary(kind, MakeUnary(kind, x1)));
    CHECK_WRITE(fmt::format("{0}(x1 + x1)", str(kind)),
        MakeUnary(kind, MakeBinary(ex::ADD, x1, x1)));
  }
}